

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O2

char * alarm_id_to_string(uint8_t alarm_id)

{
  uint uVar1;
  ulong uVar2;
  undefined3 in_register_00000039;
  
  uVar1 = 0x29;
  if (alarm_id < 0x28) {
    uVar1 = CONCAT31(in_register_00000039,alarm_id);
  }
  uVar2 = 0x28;
  if (CONCAT31(in_register_00000039,alarm_id) != 99) {
    uVar2 = (ulong)uVar1;
  }
  return alarm_type_str[uVar2];
}

Assistant:

const char* alarm_id_to_string(uint8_t alarm_id) {
    int alarm_index;

    /* Our Alarm Table only has 41 entries, if alarm is 99 (Un-Alarm) set it to 40,
     * if our alarm is > 39 (last valid alarm, except 99) then use alarm 41 to display
     * "Unknown Alarm."
     */
    if (alarm_id == 99) {
        alarm_index = 40;
    } else if (alarm_id > 39) {
        alarm_index = 41;
    } else {
        alarm_index = alarm_id;
    }

    return alarm_type_str[alarm_index];
}